

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall DRAG<RemSP>::PerformLabeling(DRAG<RemSP> *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  Mat1i *pMVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined4 uVar16;
  ulong uVar17;
  int iVar19;
  uint uVar20;
  long lVar21;
  uint *puVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint local_c8;
  Mat local_90 [96];
  ulong uVar18;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar12 = *(uint *)&pMVar6->field_0x8;
  uVar11 = (ulong)uVar12;
  iVar19 = *(int *)&pMVar6->field_0xc;
  lVar26 = (long)iVar19;
  cv::Mat::Mat(local_90,**(int **)&pMVar6->field_0x40,(*(int **)&pMVar6->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  RemSP::P_ = (uint *)operator_new__((ulong)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
                                             ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  uVar9 = 1;
  if (0 < (int)uVar12) {
    uVar17 = 0;
    do {
      if (0 < iVar19) {
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar13 = **(long **)&pMVar6->field_0x48;
        lVar14 = lVar13 * uVar17 + *(long *)&pMVar6->field_0x10;
        lVar27 = lVar14 - lVar13;
        lVar21 = lVar27 - lVar13;
        lVar13 = lVar13 + lVar14;
        lVar28 = **(long **)&pMVar7->field_0x48;
        lVar29 = lVar28 * uVar17 + *(long *)&pMVar7->field_0x10;
        lVar23 = lVar29 + lVar28 * -2;
        lVar28 = lVar21 + -1;
        uVar24 = uVar17 | 1;
        uVar32 = 0;
        do {
          if (*(char *)(lVar14 + uVar32) == '\0') {
            if ((uVar24 < uVar11) && (*(char *)(lVar13 + uVar32) != '\0')) {
              uVar10 = uVar32 | 1;
              if (((long)uVar10 < lVar26) && (*(char *)(lVar14 + uVar10) != '\0')) {
                if (uVar32 != 0) {
                  if (*(char *)((uVar32 - 1) + lVar14) != '\0') {
                    if (uVar17 != 0) {
                      if (*(char *)(lVar27 + uVar10) == '\0') goto LAB_0011c677;
                      goto LAB_0011c56a;
                    }
                    goto LAB_0011cada;
                  }
                  if (*(char *)(lVar13 + -1 + uVar32) == '\0') goto LAB_0011c61b;
                  if (uVar17 == 0) goto LAB_0011cada;
                  if (*(char *)(lVar27 + uVar10) == '\0') {
                    if ((lVar26 <= (long)(uVar32 + 2)) || (*(char *)(lVar27 + uVar32 + 2) == '\0'))
                    {
                      if (*(char *)(lVar27 + uVar32) == '\0') goto LAB_0011cada;
                      cVar2 = *(char *)((uVar32 - 2) + lVar14);
                      goto joined_r0x0011cacf;
                    }
                    if (*(char *)(lVar21 + uVar10) == '\0') {
                      if (*(char *)(lVar27 + uVar32) == '\0') goto LAB_0011c6aa;
                      if (*(char *)(lVar14 + -2 + uVar32) == '\0') {
                        uVar9 = RemSP::Merge(*(uint *)(lVar23 + uVar32 * 4),
                                             *(uint *)(lVar23 + 8 + uVar32 * 4));
                        uVar20 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                      }
                      else {
                        if (*(char *)(lVar27 + -1 + uVar32) == '\0') goto LAB_0011cb09;
                        uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
                        uVar20 = *(uint *)(lVar23 + 8 + uVar32 * 4);
                      }
                      uVar9 = RemSP::Merge(uVar9,uVar20);
                      *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                      goto LAB_0011cae3;
                    }
                  }
                  if (*(char *)((uVar32 - 2) + lVar14) == '\0') goto LAB_0011c9de;
LAB_0011c6f2:
                  if (uVar32 != 0 && uVar17 != 0) {
                    if (*(char *)(lVar27 + -1 + uVar32) != '\0') {
LAB_0011c8ad:
                      if (uVar17 != 0) {
                        if (*(char *)(lVar27 + uVar32) != '\0') goto LAB_0011c812;
                        goto LAB_0011c765;
                      }
                      goto LAB_0011c8f8;
                    }
LAB_0011c716:
                    if (*(char *)(lVar27 + -2 + uVar32) != '\0') {
                      if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_0011c8ad;
                      goto LAB_0011c8f8;
                    }
                  }
LAB_0011c9a2:
                  uVar9 = *(uint *)(lVar23 + uVar32 * 4);
                  uVar20 = *(uint *)(lVar29 + (uVar32 - 2) * 4);
LAB_0011c9ae:
                  uVar9 = RemSP::Merge(uVar9,uVar20);
                  *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                  goto LAB_0011cae3;
                }
                uVar10 = 1;
LAB_0011c61b:
                if (((uVar17 != 0) && ((long)uVar10 < lVar26)) &&
                   (*(char *)(lVar27 + uVar10) != '\0')) goto LAB_0011c7d2;
                if ((uVar17 == 0) || (lVar26 <= (long)(uVar32 + 2))) {
                  if (uVar17 == 0) goto LAB_0011c845;
                }
                else if (*(char *)(lVar27 + uVar32 + 2) != '\0') {
                  if (*(char *)(lVar27 + uVar32) == '\0') goto LAB_0011c95e;
                  goto LAB_0011c7a7;
                }
                if (*(char *)(lVar27 + uVar32) != '\0') goto LAB_0011c7d2;
              }
              else if ((uVar32 != 0) &&
                      ((*(char *)((uVar32 - 1) + lVar13) != '\0' ||
                       (*(char *)(lVar14 + -1 + uVar32) != '\0')))) goto LAB_0011cada;
LAB_0011c845:
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar9 = RemSP::length_ + 1;
              *(uint *)(lVar29 + uVar32 * 4) = RemSP::length_;
              RemSP::length_ = uVar9;
            }
            else {
              uVar10 = uVar32 | 1;
              if ((long)uVar10 < lVar26) {
                if (*(char *)(lVar14 + uVar10) != '\0') goto LAB_0011c61b;
                if ((uVar24 < uVar11) && (*(char *)(lVar13 + uVar10) != '\0')) goto LAB_0011c845;
              }
              *(undefined4 *)(lVar29 + uVar32 * 4) = 0;
            }
          }
          else {
            if (uVar32 == 0) {
LAB_0011c737:
              uVar10 = uVar32 | 1;
              if ((uVar17 == 0) ||
                 ((lVar26 <= (long)uVar10 || (*(char *)(lVar27 + uVar10) == '\0')))) {
                if (((long)uVar10 < lVar26) &&
                   (((*(char *)(lVar14 + uVar10) != '\0' && (uVar17 != 0)) &&
                    ((long)(uVar32 + 2) < lVar26)))) {
                  if (*(char *)(lVar27 + uVar32 + 2) != '\0') {
                    if (*(char *)(lVar27 + uVar32) == '\0') {
                      if ((uVar32 == 0) || (*(char *)(lVar27 + -1 + uVar32) == '\0')) {
LAB_0011c95e:
                        uVar9 = *(uint *)(lVar23 + 8 + uVar32 * 4);
                        goto LAB_0011cadf;
                      }
                      if (*(char *)(lVar21 + uVar10) == '\0') goto LAB_0011c954;
                      goto LAB_0011c765;
                    }
LAB_0011c7a7:
                    if ((lVar26 <= (long)uVar10) || (*(char *)(lVar21 + uVar10) == '\0')) {
                      uVar9 = *(uint *)(lVar23 + uVar32 * 4);
                      goto LAB_0011c7bb;
                    }
                    goto LAB_0011c7d2;
                  }
                }
                else if (uVar17 == 0) goto LAB_0011c845;
                if (*(char *)(lVar27 + uVar32) != '\0') goto LAB_0011c7d2;
                if ((uVar17 == 0 || uVar32 == 0) || (*(char *)(lVar27 + -1 + uVar32) == '\0'))
                goto LAB_0011c845;
              }
              else {
                if (((*(char *)(lVar27 + uVar32) != '\0') || (uVar32 == 0)) ||
                   (*(char *)(lVar27 + -1 + uVar32) == '\0')) {
LAB_0011c7d2:
                  uVar9 = *(uint *)(lVar23 + uVar32 * 4);
                  goto LAB_0011cadf;
                }
LAB_0011c765:
                if (*(char *)(lVar21 + uVar32) == '\0') {
LAB_0011c8f8:
                  uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
                  goto LAB_0011c8fd;
                }
              }
LAB_0011c812:
              uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
            }
            else {
              if (*(char *)(lVar14 + -1 + uVar32) == '\0') {
                if ((uVar11 <= uVar24) || (*(char *)(lVar13 + -1 + uVar32) == '\0'))
                goto LAB_0011c737;
                uVar10 = uVar32 | 1;
                if (((uVar17 != 0) && ((long)uVar10 < lVar26)) &&
                   (*(char *)(lVar27 + uVar10) != '\0')) {
                  if (*(char *)((uVar32 - 2) + lVar14) != '\0') goto LAB_0011c6f2;
                  if ((*(char *)(lVar27 + uVar32) != '\0') ||
                     (*(char *)(lVar27 + -1 + uVar32) == '\0')) goto LAB_0011c9de;
LAB_0011ca13:
                  if ((uVar17 == 0) || (*(char *)(lVar21 + uVar32) == '\0')) {
                    uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
                    uVar20 = *(uint *)(lVar23 + uVar32 * 4);
LAB_0011cb79:
                    uVar9 = RemSP::Merge(uVar9,uVar20);
                    uVar20 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  }
                  else {
                    uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
LAB_0011caa9:
                    uVar20 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  }
                  goto LAB_0011c9ae;
                }
                if ((lVar26 <= (long)uVar10) ||
                   ((((*(char *)(lVar14 + uVar10) == '\0' || (uVar17 == 0)) ||
                     (lVar26 <= (long)(uVar32 + 2))) || (*(char *)(lVar27 + uVar32 + 2) == '\0'))))
                {
                  if (uVar17 == 0) goto LAB_0011cada;
                  if (*(char *)(lVar27 + -1 + uVar32) == '\0') {
                    if (*(char *)(lVar27 + uVar32) == '\0') goto LAB_0011cada;
                    if (*(char *)((uVar32 - 2) + lVar14) == '\0') goto LAB_0011c9de;
                    goto LAB_0011c97c;
                  }
                  uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
                  if (*(char *)(lVar14 + -2 + uVar32) == '\0') goto LAB_0011c9e2;
LAB_0011c999:
                  *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                  goto LAB_0011cae3;
                }
                if (*(char *)(lVar14 + -2 + uVar32) == '\0') {
                  if (*(char *)(lVar27 + uVar32) != '\0') {
                    uVar9 = *(uint *)(lVar23 + uVar32 * 4);
                    if (*(char *)(lVar21 + uVar10) == '\0') {
                      uVar20 = *(uint *)(lVar23 + 8 + uVar32 * 4);
                      goto LAB_0011cb79;
                    }
                    goto LAB_0011caa9;
                  }
                  if (*(char *)(lVar27 + -1 + uVar32) == '\0') goto LAB_0011c6aa;
                  if (*(char *)(lVar21 + uVar10) != '\0') goto LAB_0011ca13;
                  uVar9 = RemSP::Merge(*(uint *)(lVar23 + -8 + uVar32 * 4),
                                       *(uint *)(lVar23 + 8 + uVar32 * 4));
                  uVar20 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  goto LAB_0011c9e7;
                }
                if (*(char *)(lVar27 + -1 + uVar32) == '\0') {
                  if (*(char *)(lVar21 + uVar10) != '\0') goto LAB_0011c716;
                  if (*(char *)(lVar27 + uVar32) != '\0') {
LAB_0011cb09:
                    lVar1 = uVar32 - 2;
                    if ((uVar32 == 0 || uVar17 == 0) || (*(char *)(lVar27 + lVar1) == '\0')) {
                      uVar9 = RemSP::Merge(*(uint *)(lVar23 + uVar32 * 4),
                                           *(uint *)(lVar23 + 8 + uVar32 * 4));
                      uVar20 = *(uint *)(lVar29 + lVar1 * 4);
                      goto LAB_0011c9e7;
                    }
                    if (*(char *)(lVar28 + uVar32) == '\0') {
                      uVar9 = RemSP::Merge(*(uint *)(lVar23 + uVar32 * 4),
                                           *(uint *)(lVar23 + 8 + uVar32 * 4));
                      uVar20 = *(uint *)(lVar29 + lVar1 * 4);
                    }
                    else {
                      uVar9 = *(uint *)(lVar23 + lVar1 * 4);
                      uVar20 = *(uint *)(lVar23 + 8 + uVar32 * 4);
                    }
                    goto LAB_0011c9ae;
                  }
LAB_0011c6aa:
                  uVar9 = *(uint *)(lVar23 + 8 + uVar32 * 4);
                  goto LAB_0011c9e2;
                }
                if (*(char *)(lVar21 + uVar10) != '\0') goto LAB_0011c8ad;
LAB_0011c954:
                uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
LAB_0011c7bb:
                uVar20 = *(uint *)(lVar23 + 8 + uVar32 * 4);
              }
              else {
                uVar10 = uVar32 | 1;
                if (((uVar17 == 0) || (lVar26 <= (long)uVar10)) ||
                   (*(char *)(lVar27 + uVar10) == '\0')) {
                  if (((long)uVar10 < lVar26) && (*(char *)(lVar14 + uVar10) != '\0')) {
LAB_0011c677:
                    if ((uVar17 != 0) &&
                       (((long)(uVar32 + 2) < lVar26 && (*(char *)(lVar27 + uVar32 + 2) != '\0'))))
                    {
                      if (*(char *)(lVar21 + 1 + uVar32) == '\0') goto LAB_0011c6aa;
                      goto LAB_0011c56a;
                    }
                  }
LAB_0011cada:
                  uVar9 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  goto LAB_0011cadf;
                }
LAB_0011c56a:
                if (*(char *)(lVar27 + uVar32) != '\0') goto LAB_0011c7d2;
                cVar2 = *(char *)(lVar21 + uVar32);
joined_r0x0011cacf:
                if (cVar2 == '\0') {
LAB_0011c9de:
                  uVar9 = *(uint *)(lVar23 + uVar32 * 4);
LAB_0011c9e2:
                  uVar20 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  goto LAB_0011c9e7;
                }
                if (uVar32 == 0 || uVar17 == 0) goto LAB_0011c9a2;
                if (*(char *)(lVar27 + -1 + uVar32) != '\0') goto LAB_0011c812;
LAB_0011c97c:
                if (*(char *)(lVar27 + -2 + uVar32) == '\0') goto LAB_0011c9a2;
                uVar9 = *(uint *)(lVar23 + -8 + uVar32 * 4);
                if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_0011c999;
LAB_0011c8fd:
                uVar20 = *(uint *)(lVar23 + uVar32 * 4);
              }
LAB_0011c9e7:
              uVar9 = RemSP::Merge(uVar9,uVar20);
            }
LAB_0011cadf:
            *(uint *)(lVar29 + uVar32 * 4) = uVar9;
          }
LAB_0011cae3:
          uVar32 = uVar32 + 2;
        } while ((long)uVar32 < lVar26);
      }
      puVar22 = RemSP::P_;
      uVar17 = uVar17 + 2;
    } while ((int)uVar17 < (int)uVar12);
    uVar9 = 1;
    if (1 < RemSP::length_) {
      uVar9 = 1;
      uVar11 = 1;
      do {
        if (puVar22[uVar11] < uVar11) {
          uVar12 = puVar22[puVar22[uVar11]];
        }
        else {
          uVar12 = uVar9;
          uVar9 = uVar9 + 1;
        }
        puVar22[uVar11] = uVar12;
        uVar11 = uVar11 + 1;
      } while (uVar11 < RemSP::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar22 = RemSP::P_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar12 = *(uint *)&pMVar7->field_0x8;
  uVar20 = uVar12 & 0xfffffffe;
  uVar9 = *(uint *)&pMVar7->field_0xc;
  local_c8 = uVar9 & 0x80000001;
  uVar17 = (long)(int)uVar9 & 0xfffffffffffffffe;
  uVar11 = 0;
  iVar19 = (int)uVar17;
  if (0 < (int)uVar20) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar13 = *(long *)&pMVar6->field_0x10;
    lVar14 = **(long **)&pMVar6->field_0x48;
    lVar21 = *(long *)&pMVar7->field_0x10;
    lVar23 = **(long **)&pMVar7->field_0x48;
    lVar26 = lVar21 + lVar23;
    lVar28 = lVar13 + 1 + lVar14;
    lVar29 = lVar13 + 1;
    uVar24 = 0;
    lVar27 = lVar21;
    do {
      puVar8 = RemSP::P_;
      lVar15 = lVar23 * uVar24 + lVar21;
      lVar1 = lVar15 + lVar23;
      if (iVar19 < 1) {
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        do {
          lVar30 = (long)*(int *)(lVar27 + uVar32 * 4);
          if (lVar30 < 1) {
            *(undefined8 *)(lVar27 + uVar32 * 4) = 0;
            uVar10 = uVar32 + 1;
            *(undefined4 *)(lVar26 + uVar32 * 4) = 0;
            uVar16 = 0;
          }
          else {
            uVar5 = puVar8[lVar30];
            uVar25 = uVar5;
            if (*(char *)(lVar29 + -1 + uVar32) == '\0') {
              uVar25 = 0;
            }
            *(uint *)(lVar27 + uVar32 * 4) = uVar25;
            uVar10 = uVar32 | 1;
            uVar25 = uVar5;
            if (*(char *)(lVar29 + uVar32) == '\0') {
              uVar25 = 0;
            }
            *(uint *)(lVar27 + 4 + uVar32 * 4) = uVar25;
            uVar25 = uVar5;
            if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
              uVar25 = 0;
            }
            *(uint *)(lVar26 + uVar32 * 4) = uVar25;
            uVar18 = (ulong)uVar5;
            if (*(char *)(lVar28 + uVar32) == '\0') {
              uVar18 = uVar11;
            }
            uVar16 = (undefined4)uVar18;
          }
          *(undefined4 *)(lVar1 + uVar10 * 4) = uVar16;
          uVar32 = uVar32 + 2;
        } while ((long)uVar32 < (long)uVar17);
      }
      if (local_c8 == 1) {
        lVar30 = (long)*(int *)(lVar15 + uVar32 * 4);
        if (lVar30 < 1) {
          *(undefined4 *)(lVar15 + uVar32 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar32 * 4) = 0;
        }
        else {
          lVar31 = lVar14 * uVar24 + lVar13;
          uVar5 = puVar22[lVar30];
          uVar10 = (ulong)uVar5;
          if (*(char *)(lVar31 + uVar32) == '\0') {
            uVar10 = uVar11;
          }
          *(int *)(lVar15 + uVar32 * 4) = (int)uVar10;
          if (*(char *)(lVar31 + lVar14 + uVar32) == '\0') {
            *(undefined4 *)(lVar1 + uVar32 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar32 * 4) = uVar5;
          }
        }
      }
      uVar24 = uVar24 + 2;
      lVar26 = lVar26 + lVar23 * 2;
      lVar28 = lVar28 + lVar14 * 2;
      lVar29 = lVar29 + lVar14 * 2;
      lVar27 = lVar27 + lVar23 * 2;
    } while (uVar24 < uVar20);
    uVar11 = uVar24 & 0xffffffff;
  }
  puVar22 = RemSP::P_;
  if ((uVar12 & 0x80000001) == 1) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar26 = *(long *)&pMVar6->field_0x10;
    lVar14 = **(long **)&pMVar6->field_0x48 * uVar11;
    lVar28 = *(long *)&pMVar7->field_0x10;
    lVar13 = uVar11 * **(long **)&pMVar7->field_0x48;
    if (iVar19 < 1) {
      uVar11 = 0;
    }
    else {
      lVar21 = lVar14 + lVar26;
      lVar23 = lVar13 + lVar28;
      uVar11 = 0;
      do {
        lVar27 = (long)*(int *)(lVar23 + uVar11 * 4);
        if (lVar27 < 1) {
          *(undefined8 *)(lVar23 + uVar11 * 4) = 0;
        }
        else {
          uVar12 = puVar22[lVar27];
          uVar20 = uVar12;
          if (*(char *)(lVar21 + uVar11) == '\0') {
            uVar20 = 0;
          }
          *(uint *)(lVar23 + uVar11 * 4) = uVar20;
          if (*(char *)(lVar21 + 1 + uVar11) == '\0') {
            *(undefined4 *)(lVar23 + 4 + uVar11 * 4) = 0;
          }
          else {
            *(uint *)(lVar23 + 4 + uVar11 * 4) = uVar12;
          }
        }
        uVar11 = uVar11 + 2;
      } while (uVar11 < ((long)(int)uVar9 & 0xfffffffeU));
    }
    puVar22 = RemSP::P_;
    if (local_c8 == 1) {
      lVar28 = lVar28 + lVar13;
      lVar13 = (long)*(int *)(lVar28 + uVar11 * 4);
      if ((0 < lVar13) && (*(char *)(lVar26 + lVar14 + uVar11) != '\0')) {
        *(uint *)(lVar28 + uVar11 * 4) = RemSP::P_[lVar13];
        goto LAB_0011cef4;
      }
      *(undefined4 *)(lVar28 + uVar11 * 4) = 0;
    }
  }
  puVar22 = RemSP::P_;
  if (RemSP::P_ == (uint *)0x0) {
    return;
  }
LAB_0011cef4:
  operator_delete__(puVar22);
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }